

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_resetCCtx_byAttachingCDict
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_CCtx_params params,U64 pledgedSrcSize,
                 ZSTD_buffered_policy_e zbuff)

{
  ZSTD_compressionParameters cPar;
  uint uVar1;
  U32 cdictLen;
  U32 cdictEnd;
  size_t err_code;
  uint local_4c;
  undefined1 auStack_48 [4];
  uint windowLog;
  ZSTD_compressionParameters adjusted_cdict_cParams;
  ZSTD_buffered_policy_e zbuff_local;
  U64 pledgedSrcSize_local;
  ZSTD_CDict *cdict_local;
  ZSTD_CCtx *cctx_local;
  
  auStack_48 = (undefined1  [4])(cdict->matchState).cParams.windowLog;
  windowLog = (cdict->matchState).cParams.chainLog;
  adjusted_cdict_cParams.windowLog = (cdict->matchState).cParams.hashLog;
  adjusted_cdict_cParams.chainLog = (cdict->matchState).cParams.searchLog;
  adjusted_cdict_cParams.hashLog = (cdict->matchState).cParams.minMatch;
  adjusted_cdict_cParams.searchLog = (cdict->matchState).cParams.targetLength;
  adjusted_cdict_cParams.minMatch = (cdict->matchState).cParams.strategy;
  local_4c = params.cParams.windowLog;
  adjusted_cdict_cParams.targetLength = zbuff;
  unique0x10000507 = pledgedSrcSize;
  if ((cdict->matchState).dedicatedDictSearch != 0) {
    ZSTD_dedicatedDictSearch_revertCParams((ZSTD_compressionParameters *)auStack_48);
  }
  cPar.hashLog = adjusted_cdict_cParams.windowLog;
  cPar.searchLog = adjusted_cdict_cParams.chainLog;
  cPar.windowLog = (uint)auStack_48;
  cPar.chainLog = windowLog;
  cPar.minMatch = adjusted_cdict_cParams.hashLog;
  cPar.targetLength = adjusted_cdict_cParams.searchLog;
  cPar.strategy = adjusted_cdict_cParams.minMatch;
  ZSTD_adjustCParams_internal
            ((ZSTD_compressionParameters *)&err_code,cPar,stack0xffffffffffffffd8,
             cdict->dictContentSize,ZSTD_cpm_attachDict);
  params.cParams.windowLog = local_4c;
  cctx_local = (ZSTD_CCtx *)
               ZSTD_resetCCtx_internal
                         (cctx,&params,stack0xffffffffffffffd8,0,ZSTDcrp_makeClean,
                          adjusted_cdict_cParams.targetLength);
  uVar1 = ERR_isError((size_t)cctx_local);
  if (uVar1 == 0) {
    uVar1 = (int)(cdict->matchState).window.nextSrc - (int)(cdict->matchState).window.base;
    if (uVar1 != (cdict->matchState).window.dictLimit) {
      (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
      if ((cctx->blockState).matchState.window.dictLimit < uVar1) {
        (cctx->blockState).matchState.window.nextSrc =
             (cctx->blockState).matchState.window.base + uVar1;
        ZSTD_window_clear(&(cctx->blockState).matchState.window);
      }
      (cctx->blockState).matchState.loadedDictEnd = (cctx->blockState).matchState.window.dictLimit;
    }
    cctx->dictID = cdict->dictID;
    cctx->dictContentSize = cdict->dictContentSize;
    memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
    cctx_local = (ZSTD_CCtx *)0x0;
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t
ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx* cctx,
                        const ZSTD_CDict* cdict,
                        ZSTD_CCtx_params params,
                        U64 pledgedSrcSize,
                        ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(4, "ZSTD_resetCCtx_byAttachingCDict() pledgedSrcSize=%llu",
                (unsigned long long)pledgedSrcSize);
    {
        ZSTD_compressionParameters adjusted_cdict_cParams = cdict->matchState.cParams;
        unsigned const windowLog = params.cParams.windowLog;
        assert(windowLog != 0);
        /* Resize working context table params for input only, since the dict
         * has its own tables. */
        /* pledgedSrcSize == 0 means 0! */

        if (cdict->matchState.dedicatedDictSearch) {
            ZSTD_dedicatedDictSearch_revertCParams(&adjusted_cdict_cParams);
        }

        params.cParams = ZSTD_adjustCParams_internal(adjusted_cdict_cParams, pledgedSrcSize,
                                                     cdict->dictContentSize, ZSTD_cpm_attachDict);
        params.cParams.windowLog = windowLog;
        params.useRowMatchFinder = cdict->useRowMatchFinder;    /* cdict overrides */
        FORWARD_IF_ERROR(ZSTD_resetCCtx_internal(cctx, &params, pledgedSrcSize,
                                                 /* loadedDictSize */ 0,
                                                 ZSTDcrp_makeClean, zbuff), "");
        assert(cctx->appliedParams.cParams.strategy == adjusted_cdict_cParams.strategy);
    }

    {   const U32 cdictEnd = (U32)( cdict->matchState.window.nextSrc
                                  - cdict->matchState.window.base);
        const U32 cdictLen = cdictEnd - cdict->matchState.window.dictLimit;
        if (cdictLen == 0) {
            /* don't even attach dictionaries with no contents */
            DEBUGLOG(4, "skipping attaching empty dictionary");
        } else {
            DEBUGLOG(4, "attaching dictionary into context");
            cctx->blockState.matchState.dictMatchState = &cdict->matchState;

            /* prep working match state so dict matches never have negative indices
             * when they are translated to the working context's index space. */
            if (cctx->blockState.matchState.window.dictLimit < cdictEnd) {
                cctx->blockState.matchState.window.nextSrc =
                    cctx->blockState.matchState.window.base + cdictEnd;
                ZSTD_window_clear(&cctx->blockState.matchState.window);
            }
            /* loadedDictEnd is expressed within the referential of the active context */
            cctx->blockState.matchState.loadedDictEnd = cctx->blockState.matchState.window.dictLimit;
    }   }

    cctx->dictID = cdict->dictID;
    cctx->dictContentSize = cdict->dictContentSize;

    /* copy block state */
    ZSTD_memcpy(cctx->blockState.prevCBlock, &cdict->cBlockState, sizeof(cdict->cBlockState));

    return 0;
}